

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,GeneratorOptions *options,
          FieldDescriptor *field)

{
  once_flag *__once;
  GeneratorOptions *options_00;
  LogMessage *other;
  Descriptor *from_file;
  string *psVar1;
  Descriptor *in_R8;
  GeneratorOptions *local_60;
  LogMessage local_58;
  
  __once = (once_flag *)(options->namespace_prefix).field_2._M_allocated_capacity;
  if (__once != (once_flag *)0x0) {
    local_58._0_8_ = FieldDescriptor::TypeOnceInit;
    local_60 = options;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (__once,(_func_void_FieldDescriptor_ptr **)&local_58,(FieldDescriptor **)&local_60);
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap +
              (ulong)*(uint *)((long)&(options->namespace_prefix).field_2 + 8) * 4) != 10) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
               ,0xff);
    other = internal::LogMessage::operator<<
                      (&local_58,
                       "CHECK failed: field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE: ");
    internal::LogFinisher::operator=((LogFinisher *)&local_60,other);
    internal::LogMessage::~LogMessage(&local_58);
  }
  options_00 = (GeneratorOptions *)(options->namespace_prefix)._M_string_length;
  from_file = FieldDescriptor::message_type((FieldDescriptor *)options);
  psVar1 = MaybeCrossFileRef_abi_cxx11_
                     (__return_storage_ptr__,this,options_00,(FileDescriptor *)from_file,in_R8);
  return psVar1;
}

Assistant:

std::string SubmessageTypeRef(const GeneratorOptions& options,
                              const FieldDescriptor* field) {
  GOOGLE_CHECK(field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE);
  return MaybeCrossFileRef(options, field->file(), field->message_type());
}